

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitstream.cpp
# Opt level: O0

bool slang::ast::withAfterDynamic
               (StreamingConcatenationExpression *lhs,SourceRange **dynamic,SourceRange **with)

{
  bool bVar1;
  SourceRange **in_RDX;
  StreamingConcatenationExpression *in_RSI;
  StreamingConcatenationExpression *in_RDI;
  Expression *operand;
  StreamExpression *stream;
  iterator __end2;
  iterator __begin2;
  span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
  *__range2;
  Expression *in_stack_ffffffffffffffa8;
  reference in_stack_ffffffffffffffb0;
  span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
  *in_stack_ffffffffffffffb8;
  __normal_iterator<const_slang::ast::StreamingConcatenationExpression::StreamExpression_*,_std::span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>_>
  local_40;
  span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
  local_38;
  span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
  *with_00;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  local_38 = StreamingConcatenationExpression::streams(in_RDI);
  with_00 = &local_38;
  local_40._M_current =
       (StreamExpression *)
       std::
       span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
       ::begin((span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
                *)in_stack_ffffffffffffffa8);
  std::
  span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
  ::end(in_stack_ffffffffffffffb8);
  do {
    bVar1 = __gnu_cxx::
            operator==<const_slang::ast::StreamingConcatenationExpression::StreamExpression_*,_std::span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>_>
                      ((__normal_iterator<const_slang::ast::StreamingConcatenationExpression::StreamExpression_*,_std::span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffffb0,
                       (__normal_iterator<const_slang::ast::StreamingConcatenationExpression::StreamExpression_*,_std::span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffffa8);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return false;
    }
    in_stack_ffffffffffffffb0 =
         __gnu_cxx::
         __normal_iterator<const_slang::ast::StreamingConcatenationExpression::StreamExpression_*,_std::span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>_>
         ::operator*(&local_40);
    in_stack_ffffffffffffffa8 =
         not_null<const_slang::ast::Expression_*>::operator*
                   ((not_null<const_slang::ast::Expression_*> *)0x882022);
    if (in_stack_ffffffffffffffa8->kind == Streaming) {
      Expression::as<slang::ast::StreamingConcatenationExpression>(in_stack_ffffffffffffffa8);
      bVar1 = withAfterDynamic(in_RSI,in_RDX,(SourceRange **)with_00);
      if (bVar1) {
        return true;
      }
    }
    else if (in_stack_ffffffffffffffb0->withExpr == (Expression *)0x0) {
      if (*(long *)&in_RSI->super_Expression == 0) {
        not_null<const_slang::ast::Type_*>::operator->
                  ((not_null<const_slang::ast::Type_*> *)0x8820a9);
        bVar1 = Type::isFixedSize((Type *)CONCAT17(in_stack_ffffffffffffffff,
                                                   in_stack_fffffffffffffff8));
        if (!bVar1) {
          *(SourceRange **)&in_RSI->super_Expression = &in_stack_ffffffffffffffa8->sourceRange;
        }
      }
    }
    else {
      *in_RDX = &in_stack_ffffffffffffffb0->withExpr->sourceRange;
      if (*(long *)&in_RSI->super_Expression != 0) {
        return true;
      }
    }
    __gnu_cxx::
    __normal_iterator<const_slang::ast::StreamingConcatenationExpression::StreamExpression_*,_std::span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>_>
    ::operator++(&local_40);
  } while( true );
}

Assistant:

static bool withAfterDynamic(const StreamingConcatenationExpression& lhs,
                             const SourceRange*& dynamic, const SourceRange*& with) {
    // The expression within the "with" is evaluated immediately before its corresponding array is
    // streamed. The first dynamically sized item without "with" constraints accept all the
    // available data. If the former appears after the latter, evaluation order has conflict.
    for (auto& stream : lhs.streams()) {
        auto& operand = *stream.operand;
        if (operand.kind == ExpressionKind::Streaming) {
            if (withAfterDynamic(operand.as<StreamingConcatenationExpression>(), dynamic, with))
                return true;
        }
        else if (stream.withExpr) {
            with = &stream.withExpr->sourceRange;
            if (dynamic)
                return true;
        }
        else if (!dynamic && !operand.type->isFixedSize()) {
            dynamic = &operand.sourceRange;
        }
    }
    return false;
}